

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_cnv.cpp
# Opt level: O0

void ucnv_fromUWriteBytes_63
               (UConverter *cnv,char *bytes,int32_t length,char **target,char *targetLimit,
               int32_t **offsets,int32_t sourceIndex,UErrorCode *pErrorCode)

{
  int32_t *local_48;
  int32_t *o;
  char *t;
  int32_t **offsets_local;
  char *targetLimit_local;
  char **target_local;
  char *pcStack_18;
  int32_t length_local;
  char *bytes_local;
  UConverter *cnv_local;
  
  o = (int32_t *)*target;
  target_local._4_4_ = length;
  pcStack_18 = bytes;
  if ((offsets == (int32_t **)0x0) || (local_48 = *offsets, local_48 == (int32_t *)0x0)) {
    for (; 0 < target_local._4_4_ && o < targetLimit; target_local._4_4_ = target_local._4_4_ + -1)
    {
      *(char *)o = *pcStack_18;
      o = (int32_t *)((long)o + 1);
      pcStack_18 = pcStack_18 + 1;
    }
  }
  else {
    for (; 0 < target_local._4_4_ && o < targetLimit; target_local._4_4_ = target_local._4_4_ + -1)
    {
      *(char *)o = *pcStack_18;
      *local_48 = sourceIndex;
      local_48 = local_48 + 1;
      o = (int32_t *)((long)o + 1);
      pcStack_18 = pcStack_18 + 1;
    }
    *offsets = local_48;
  }
  *target = (char *)o;
  if (0 < target_local._4_4_) {
    if (cnv != (UConverter *)0x0) {
      cnv->charErrorBufferLength = (int8_t)target_local._4_4_;
      o = (int32_t *)cnv->charErrorBuffer;
      do {
        *(char *)o = *pcStack_18;
        target_local._4_4_ = target_local._4_4_ + -1;
        o = (int32_t *)((long)o + 1);
        pcStack_18 = pcStack_18 + 1;
      } while (0 < target_local._4_4_);
    }
    *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
  }
  return;
}

Assistant:

U_CFUNC void
ucnv_fromUWriteBytes(UConverter *cnv,
                     const char *bytes, int32_t length,
                     char **target, const char *targetLimit,
                     int32_t **offsets,
                     int32_t sourceIndex,
                     UErrorCode *pErrorCode) {
    char *t=*target;
    int32_t *o;

    /* write bytes */
    if(offsets==NULL || (o=*offsets)==NULL) {
        while(length>0 && t<targetLimit) {
            *t++=*bytes++;
            --length;
        }
    } else {
        /* output with offsets */
        while(length>0 && t<targetLimit) {
            *t++=*bytes++;
            *o++=sourceIndex;
            --length;
        }
        *offsets=o;
    }
    *target=t;

    /* write overflow */
    if(length>0) {
        if(cnv!=NULL) {
            t=(char *)cnv->charErrorBuffer;
            cnv->charErrorBufferLength=(int8_t)length;
            do {
                *t++=(uint8_t)*bytes++;
            } while(--length>0);
        }
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
    }
}